

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testReadDoubleTwoStep(DataFileTest *this)

{
  bool bVar1;
  DataFileReaderBase *this_00;
  ulong uVar2;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  undefined8 *in_RDI;
  double im;
  double re;
  ComplexDouble ci;
  int i;
  DataFileReader<Complex<double>_> df;
  auto_ptr<avro::DataFileReaderBase> base;
  auto_ptr<avro::DataFileReaderBase> *in_stack_fffffffffffffcb8;
  char *v;
  int *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  DataFileReader<Complex<double>_> *in_stack_fffffffffffffcd0;
  const_string *in_stack_fffffffffffffcf8;
  Complex<double> *in_stack_fffffffffffffd00;
  percent_tolerance_t<double> in_stack_fffffffffffffd08;
  const_string *in_stack_fffffffffffffd10;
  basic_cstring<const_char> local_2a0;
  undefined1 local_290 [56];
  basic_cstring<const_char> local_258;
  double local_248;
  basic_cstring<const_char> local_240;
  undefined1 local_230 [56];
  basic_cstring<const_char> local_1f8;
  double local_1e8;
  basic_cstring<const_char> local_1e0;
  undefined1 local_1d0 [40];
  ValidSchema *in_stack_fffffffffffffe58;
  basic_cstring<const_char> local_198;
  undefined1 local_188 [16];
  Complex<double> local_178;
  int local_164;
  basic_cstring<const_char> local_160 [2];
  string local_140 [32];
  basic_cstring<const_char> local_120;
  undefined1 local_110 [56];
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8 [2];
  string local_a8 [32];
  basic_cstring<const_char> local_88;
  undefined1 local_78 [56];
  basic_cstring<const_char> local_40;
  DataFileReader<Complex<double>_> local_28 [3];
  auto_ptr<avro::DataFileReaderBase> local_10 [2];
  
  this_00 = (DataFileReaderBase *)operator_new(0xe0);
  avro::DataFileReaderBase::DataFileReaderBase(this_00,(char *)*in_RDI);
  std::auto_ptr<avro::DataFileReaderBase>::auto_ptr(local_10,this_00);
  std::auto_ptr<avro::DataFileReaderBase>::auto_ptr
            ((auto_ptr<avro::DataFileReaderBase> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8);
  avro::DataFileReader<Complex<double>_>::DataFileReader
            (in_stack_fffffffffffffcd0,
             (auto_ptr<avro::DataFileReaderBase> *)in_stack_fffffffffffffcc8);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr
            ((auto_ptr<avro::DataFileReaderBase> *)in_stack_fffffffffffffcc0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd10,
               (const_string *)in_stack_fffffffffffffd08.m_value,(size_t)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcc8,(char (*) [1])in_stack_fffffffffffffcc0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    toString_abi_cxx11_(in_stack_fffffffffffffe58);
    avro::DataFileReader<Complex<double>_>::readerSchema
              ((DataFileReader<Complex<double>_> *)0x248675);
    toString_abi_cxx11_(in_stack_fffffffffffffe58);
    in_stack_fffffffffffffcc8 = "toString(df.readerSchema())";
    in_stack_fffffffffffffcc0 = (int *)local_c8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_78,&local_88,0x16e,1,2,local_a8,"toString(writerSchema)");
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string(local_a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x24870a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd10,
               (const_string *)in_stack_fffffffffffffd08.m_value,(size_t)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcc8,(char (*) [1])in_stack_fffffffffffffcc0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    toString_abi_cxx11_(in_stack_fffffffffffffe58);
    avro::DataFileReader<Complex<double>_>::dataSchema((DataFileReader<Complex<double>_> *)0x2487d1)
    ;
    toString_abi_cxx11_(in_stack_fffffffffffffe58);
    in_stack_fffffffffffffcc8 = "toString(df.dataSchema())";
    in_stack_fffffffffffffcc0 = (int *)local_160;
    v = "toString(writerSchema)";
    __nbytes = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_110,&local_120,0x16f,1,2,local_140);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string(local_140);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x248866);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_164 = 0;
  Complex<double>::Complex(&local_178);
  local_188._8_8_ = (iterator)0x4008000000000000;
  local_188._0_8_ = (iterator)0x4014000000000000;
  __buf = extraout_RDX;
  while (uVar2 = avro::DataFileReader<Complex<double>_>::read
                           (local_28,(int)&local_178,__buf,__nbytes), (uVar2 & 1) != 0) {
    do {
      in_stack_fffffffffffffd10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcc0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd10,
                 (const_string *)in_stack_fffffffffffffd08.m_value,(size_t)in_stack_fffffffffffffd00
                 ,in_stack_fffffffffffffcf8);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffcc8,(char (*) [1])in_stack_fffffffffffffcc0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      in_stack_fffffffffffffd00 = &local_178;
      in_stack_fffffffffffffd08 = boost::math::fpc::percent_tolerance<double>((double)v);
      in_stack_fffffffffffffcc8 = "re";
      in_stack_fffffffffffffcc0 = (int *)(local_188 + 8);
      v = "ci.re";
      local_1e8 = in_stack_fffffffffffffd08.m_value;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
                (local_1d0,&local_1e0,0x175,1,8,in_stack_fffffffffffffd00);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x248a0e);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      in_stack_fffffffffffffcf8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcc0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd10,
                 (const_string *)in_stack_fffffffffffffd08.m_value,(size_t)in_stack_fffffffffffffd00
                 ,in_stack_fffffffffffffcf8);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffcc8,(char (*) [1])in_stack_fffffffffffffcc0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_240,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      local_248 = (double)boost::math::fpc::percent_tolerance<double>((double)v);
      in_stack_fffffffffffffcc8 = "im";
      in_stack_fffffffffffffcc0 = (int *)local_188;
      v = "ci.im";
      __nbytes = 1;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
                (local_230,&local_240,0x176,1,8,&local_178.im);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x248b52);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_188._8_8_ = ((double)local_188._0_8_ - 0.7) + (double)local_188._8_8_;
    local_188._0_8_ = (double)local_188._0_8_ + 3.1;
    local_164 = local_164 + 1;
    __buf = extraout_RDX_00;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd10,
               (const_string *)in_stack_fffffffffffffd08.m_value,(size_t)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcc8,(char (*) [1])in_stack_fffffffffffffcc0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    in_stack_fffffffffffffcc8 = "count";
    in_stack_fffffffffffffcc0 = &count;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_290,&local_2a0,0x17b,1,2,&local_164,"i");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x248e35);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::DataFileReader<Complex<double>_>::~DataFileReader
            ((DataFileReader<Complex<double>_> *)0x248e4f);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr
            ((auto_ptr<avro::DataFileReaderBase> *)in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void testReadDoubleTwoStep() {
        auto_ptr<avro::DataFileReaderBase>
            base(new avro::DataFileReaderBase(filename));
        avro::DataFileReader<ComplexDouble> df(base);
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.readerSchema()));
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.dataSchema()));
        int i = 0;
        ComplexDouble ci;
        double re = 3.0;
        double im = 5.0;
        while (df.read(ci)) {
            BOOST_CHECK_CLOSE(ci.re, re, 0.0001);
            BOOST_CHECK_CLOSE(ci.im, im, 0.0001);
            re += (im - 0.7);
            im += 3.1;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }